

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool __thiscall MountPoint::parse(MountPoint *this,string *line)

{
  long lVar1;
  pointer pSVar2;
  size_t sVar3;
  char *pcVar4;
  StringPiece input;
  undefined8 uVar5;
  int iVar6;
  bool bVar7;
  size_t *psVar8;
  ulong uVar9;
  long lVar10;
  StringPiece input_00;
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  allocator_type local_69;
  undefined1 local_68 [17];
  undefined7 uStack_57;
  vector<StringPiece,_std::allocator<StringPiece>_> local_48;
  
  input.str_ = (line->_M_dataplus)._M_p;
  input.len_ = line->_M_string_length;
  SplitStringPiece(&local_48,input,' ');
  pSVar2 = local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  if (uVar9 < 10) {
    bVar7 = false;
  }
  else {
    psVar8 = &local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[6].len_;
    lVar10 = -7;
    do {
      if (*psVar8 == 1) {
        iVar6 = bcmp(((StringPiece *)(psVar8 + -1))->str_,"-",1);
        if (iVar6 == 0) {
          lVar10 = -lVar10;
          goto LAB_00122c85;
        }
      }
      lVar1 = lVar10 + uVar9;
      lVar10 = lVar10 + -1;
      psVar8 = psVar8 + 2;
    } while (lVar1 != 0);
    lVar10 = 0;
LAB_00122c85:
    bVar7 = false;
    if ((lVar10 != 0) && (lVar10 + 3U == uVar9)) {
      sVar3 = pSVar2->len_;
      if (sVar3 == 0) {
        local_68._0_8_ = local_68 + 0x10;
        local_68._8_8_ = (pointer)0x0;
        local_68[0x10] = 0;
      }
      else {
        pcVar4 = pSVar2->str_;
        local_68._0_8_ = local_68 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pcVar4,pcVar4 + sVar3);
      }
      uVar5 = local_68._0_8_;
      pSVar2 = (pointer)(local_68 + 0x10);
      iVar6 = atoi((char *)local_68._0_8_);
      this->mountId = iVar6;
      if ((pointer)uVar5 != pSVar2) {
        operator_delete((void *)uVar5,CONCAT71(uStack_57,local_68[0x10]) + 1);
      }
      local_68._0_8_ = pSVar2;
      if (local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_start[1].len_ == 0) {
        local_68._8_8_ = (pointer)0x0;
        local_68[0x10] = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,
                   local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start[1].str_,
                   local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start[1].str_ +
                   local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                   super__Vector_impl_data._M_start[1].len_);
      }
      uVar5 = local_68._0_8_;
      iVar6 = atoi((char *)local_68._0_8_);
      this->parentId = iVar6;
      if ((pointer)uVar5 != pSVar2) {
        operator_delete((void *)uVar5,CONCAT71(uStack_57,local_68[0x10]) + 1);
      }
      sVar3 = local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[2].len_;
      (this->deviceId).str_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[2].str_;
      (this->deviceId).len_ = sVar3;
      sVar3 = local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[3].len_;
      (this->root).str_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[3].str_;
      (this->root).len_ = sVar3;
      sVar3 = local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[4].len_;
      (this->mountPoint).str_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[4].str_;
      (this->mountPoint).len_ = sVar3;
      SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68,
                       local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                       _M_impl.super__Vector_impl_data._M_start[5],',');
      std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_move_assign
                (&this->options,local_68);
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_,CONCAT71(uStack_57,local_68[0x10]) - local_68._0_8_);
      }
      std::vector<StringPiece,std::allocator<StringPiece>>::vector<StringPiece*,void>
                ((vector<StringPiece,std::allocator<StringPiece>> *)local_68,
                 local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                 super__Vector_impl_data._M_start + 6,
                 local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar10 + -1,&local_69);
      std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_move_assign
                (&this->optionalFields,local_68);
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_,CONCAT71(uStack_57,local_68[0x10]) - local_68._0_8_);
      }
      sVar3 = local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10].len_;
      (this->fsType).str_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10].str_;
      (this->fsType).len_ = sVar3;
      sVar3 = local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10 + 1].len_;
      (this->mountSource).str_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10 + 1].str_;
      (this->mountSource).len_ = sVar3;
      input_00.len_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10 + 2].len_;
      input_00.str_ =
           local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_start[lVar10 + 2].str_;
      SplitStringPiece((vector<StringPiece,_std::allocator<StringPiece>_> *)local_68,input_00,',');
      std::vector<StringPiece,_std::allocator<StringPiece>_>::_M_move_assign
                (&this->superOptions,local_68);
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_,CONCAT71(uStack_57,local_68[0x10]) - local_68._0_8_);
      }
      bVar7 = true;
    }
  }
  if (local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool parse(const string& line) {
    vector<StringPiece> pieces = SplitStringPiece(line, ' ');
    if (pieces.size() < 10)
      return false;
    size_t optionalStart = 0;
    for (size_t i = 6; i < pieces.size(); i++) {
      if (pieces[i] == "-") {
        optionalStart = i + 1;
        break;
      }
    }
    if (optionalStart == 0)
      return false;
    if (optionalStart + 3 != pieces.size())
      return false;
    mountId = atoi(pieces[0].AsString().c_str());
    parentId = atoi(pieces[1].AsString().c_str());
    deviceId = pieces[2];
    root = pieces[3];
    mountPoint = pieces[4];
    options = SplitStringPiece(pieces[5], ',');
    optionalFields =
        vector<StringPiece>(&pieces[6], &pieces[optionalStart - 1]);
    fsType = pieces[optionalStart];
    mountSource = pieces[optionalStart + 1];
    superOptions = SplitStringPiece(pieces[optionalStart + 2], ',');
    return true;
  }